

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O0

int ProcessPacketUBX(uchar *packet,int packetlen,int mclass,int mid,UBXDATA *pUBXData)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar *__src;
  int payloadlen;
  uchar *payload;
  UBXDATA *pUBXData_local;
  int mid_local;
  int mclass_local;
  int packetlen_local;
  uchar *packet_local;
  
  __src = packet + 6;
  if (mclass == 1) {
    switch(mid) {
    case 2:
      uVar1 = *(undefined8 *)__src;
      (pUBXData->nav_posllh_pl).iTOW = (int)uVar1;
      (pUBXData->nav_posllh_pl).lon = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)(packet + 0xe);
      (pUBXData->nav_posllh_pl).lat = (int)uVar1;
      (pUBXData->nav_posllh_pl).height = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)(packet + 0x16);
      (pUBXData->nav_posllh_pl).hMSL = (int)uVar1;
      (pUBXData->nav_posllh_pl).hAcc = (int)((ulong)uVar1 >> 0x20);
      (pUBXData->nav_posllh_pl).vAcc = *(uint *)(packet + 0x1e);
      pUBXData->Latitude = (double)(pUBXData->nav_posllh_pl).lat * 1e-07;
      pUBXData->Longitude = (double)(pUBXData->nav_posllh_pl).lon * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_posllh_pl).height * 1000);
      break;
    case 3:
      uVar1 = *(undefined8 *)__src;
      (pUBXData->nav_status_pl).iTOW = (int)uVar1;
      (pUBXData->nav_status_pl).gpsFix = (char)((ulong)uVar1 >> 0x20);
      (pUBXData->nav_status_pl).flags = (flags_NAV_STATUS_PL_UBX)(char)((ulong)uVar1 >> 0x28);
      (pUBXData->nav_status_pl).fixStat = (fixStat_NAV_STATUS_PL_UBX)(char)((ulong)uVar1 >> 0x30);
      (pUBXData->nav_status_pl).flags2 = (flags2_NAV_STATUS_PL_UBX)(char)((ulong)uVar1 >> 0x38);
      uVar1 = *(undefined8 *)(packet + 0xe);
      (pUBXData->nav_status_pl).ttff = (int)uVar1;
      (pUBXData->nav_status_pl).msss = (int)((ulong)uVar1 >> 0x20);
      break;
    default:
      break;
    case 6:
      memcpy(&pUBXData->nav_sol_pl,__src,0x34);
      break;
    case 7:
      memcpy(&pUBXData->nav_pvt_pl,__src,0x5c);
      pUBXData->Latitude = (double)(pUBXData->nav_pvt_pl).lat * 1e-07;
      pUBXData->Longitude = (double)(pUBXData->nav_pvt_pl).lon * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_pvt_pl).height * 1000);
      pUBXData->year = (uint)(pUBXData->nav_pvt_pl).year;
      pUBXData->month = (uint)(pUBXData->nav_pvt_pl).month;
      pUBXData->day = (uint)(pUBXData->nav_pvt_pl).day;
      pUBXData->hour = (uint)(pUBXData->nav_pvt_pl).hour;
      pUBXData->minute = (uint)(pUBXData->nav_pvt_pl).minute;
      pUBXData->second =
           (double)(pUBXData->nav_pvt_pl).nano * 1e-09 + (double)(pUBXData->nav_pvt_pl).sec;
      pUBXData->SOG = (double)(pUBXData->nav_pvt_pl).gSpeed / 1000.0;
      pUBXData->COG = ((double)(pUBXData->nav_pvt_pl).headMot * 1e-05 * 3.141592653589793) / 180.0;
      break;
    case 0x12:
      (pUBXData->nav_velned_pl).cAcc = *(uint *)(packet + 0x26);
      uVar1 = *(undefined8 *)__src;
      uVar2 = *(undefined8 *)(packet + 0xe);
      uVar3 = *(undefined8 *)(packet + 0x16);
      uVar4 = *(undefined8 *)(packet + 0x1e);
      (pUBXData->nav_velned_pl).speed = (int)uVar3;
      (pUBXData->nav_velned_pl).gSpeed = (int)((ulong)uVar3 >> 0x20);
      (pUBXData->nav_velned_pl).heading = (int)uVar4;
      (pUBXData->nav_velned_pl).sAcc = (int)((ulong)uVar4 >> 0x20);
      (pUBXData->nav_velned_pl).iTOW = (int)uVar1;
      (pUBXData->nav_velned_pl).velN = (int)((ulong)uVar1 >> 0x20);
      (pUBXData->nav_velned_pl).velE = (int)uVar2;
      (pUBXData->nav_velned_pl).velD = (int)((ulong)uVar2 >> 0x20);
      pUBXData->SOG = (double)(pUBXData->nav_velned_pl).gSpeed / 100.0;
      pUBXData->COG =
           ((double)(pUBXData->nav_velned_pl).heading * 1e-05 * 3.141592653589793) / 180.0;
      break;
    case 0x14:
      memcpy(pUBXData,__src,0x24);
      pUBXData->Latitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).latHp * 0.01 +
           (double)(pUBXData->nav_hposllh_pl).lat) * 1e-07;
      pUBXData->Longitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).lonHp * 0.01 +
           (double)(pUBXData->nav_hposllh_pl).lon) * 1e-07;
      pUBXData->Altitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).heightHp * 0.1 +
           (double)(pUBXData->nav_hposllh_pl).height) * 1000.0;
      break;
    case 0x3b:
      memcpy(&pUBXData->nav_svin_pl,__src,0x28);
      break;
    case 0x3c:
      memcpy(&pUBXData->nav_relposned_pl,__src,0x40);
      pUBXData->Heading =
           ((double)(pUBXData->nav_relposned_pl).relPosHeading * 1e-05 * 3.141592653589793) / 180.0;
    }
  }
  else if ((mclass == 5) && (mid == 0)) {
    printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n",5,0);
    return 1;
  }
  return 0;
}

Assistant:

inline int ProcessPacketUBX(unsigned char* packet, int packetlen, int mclass, int mid, UBXDATA* pUBXData)
{
	unsigned char* payload = packet+MIN_PACKET_LENGTH_UBX-NB_BYTES_CHECKSUM_UBX;
	int payloadlen = packetlen-MIN_PACKET_LENGTH_UBX;

	UNREFERENCED_PARAMETER(payloadlen);

	//memset(pUBXData, 0, sizeof(UBXDATA));

	switch (mclass)
	{
	case ACK_CLASS_UBX:
		switch (mid)
		{
		case ACK_ACK_ID_UBX:
			break;
		case ACK_NAK_ID_UBX:
			printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n", (int)(unsigned char)mclass, (int)(unsigned char)mid);
			return EXIT_FAILURE;
		default:
			// Unhandled...
			break;
		}
		break;
	case NAV_CLASS_UBX:
		switch (mid)
		{
		case NAV_HPOSLLH_ID_UBX:
			memcpy(&pUBXData->nav_hposllh_pl, payload, LEN_NAV_HPOSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_hposllh_pl, payload, sizeof(pUBXData->nav_hposllh_pl));
			pUBXData->Latitude = (pUBXData->nav_hposllh_pl.lat+pUBXData->nav_hposllh_pl.latHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Longitude = (pUBXData->nav_hposllh_pl.lon+pUBXData->nav_hposllh_pl.lonHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Altitude = (pUBXData->nav_hposllh_pl.height+pUBXData->nav_hposllh_pl.heightHp*0.1)*1000; // In m.
			break;
		case NAV_POSLLH_ID_UBX:
			memcpy(&pUBXData->nav_posllh_pl, payload, LEN_NAV_POSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_posllh_pl, payload, sizeof(pUBXData->nav_posllh_pl));
			pUBXData->Latitude = pUBXData->nav_posllh_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_posllh_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_posllh_pl.height*1000; // In m.
			break;
		case NAV_PVT_ID_UBX:
			memcpy(&pUBXData->nav_pvt_pl, payload, LEN_NAV_PVT_PL_UBX);
			//memcpy(&pUBXData->nav_pvt_pl, payload, sizeof(pUBXData->nav_pvt_pl));
			pUBXData->Latitude = pUBXData->nav_pvt_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_pvt_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_pvt_pl.height*1000; // In m.
			pUBXData->year = pUBXData->nav_pvt_pl.year;
			pUBXData->month = pUBXData->nav_pvt_pl.month;
			pUBXData->day = pUBXData->nav_pvt_pl.day;
			pUBXData->hour = pUBXData->nav_pvt_pl.hour;
			pUBXData->minute = pUBXData->nav_pvt_pl.minute; 
			pUBXData->second = pUBXData->nav_pvt_pl.sec+0.000000001*pUBXData->nav_pvt_pl.nano;	
			pUBXData->SOG = pUBXData->nav_pvt_pl.gSpeed/1000.0; // In m/s.
			pUBXData->COG = pUBXData->nav_pvt_pl.headMot*0.00001*M_PI/180.0; // In rad.
			break;
		case NAV_RELPOSNED_ID_UBX:
			memcpy(&pUBXData->nav_relposned_pl, payload, LEN_NAV_RELPOSNED_PL_UBX);
			//memcpy(&pUBXData->nav_relposned_pl, payload, sizeof(pUBXData->nav_relposned_pl));
			pUBXData->Heading = pUBXData->nav_relposned_pl.relPosHeading*0.00001*M_PI/180.0; // In rad
			break;
		case NAV_SOL_ID_UBX:
			memcpy(&pUBXData->nav_sol_pl, payload, LEN_NAV_SOL_PL_UBX);
			//memcpy(&pUBXData->nav_sol_pl, payload, sizeof(pUBXData->nav_sol_pl));
			break;
		case NAV_STATUS_ID_UBX:
			memcpy(&pUBXData->nav_status_pl, payload, LEN_NAV_STATUS_PL_UBX);
			//memcpy(&pUBXData->nav_status_pl, payload, sizeof(pUBXData->nav_status_pl));
			break;
		case NAV_SVIN_ID_UBX:
			memcpy(&pUBXData->nav_svin_pl, payload, LEN_NAV_SVIN_PL_UBX);
			//memcpy(&pUBXData->nav_svin_pl, payload, sizeof(pUBXData->nav_svin_pl));
			break;
		case NAV_VELNED_ID_UBX:
			memcpy(&pUBXData->nav_velned_pl, payload, LEN_NAV_VELNED_PL_UBX);
			//memcpy(&pUBXData->nav_velned_pl, payload, sizeof(pUBXData->nav_velned_pl));
			pUBXData->SOG = pUBXData->nav_velned_pl.gSpeed/100.0; // In m/s.
			pUBXData->COG = pUBXData->nav_velned_pl.heading*0.00001*M_PI/180.0; // In rad.
			break;
		default:
			// Unhandled...
			break;
		}
		break;
	default:
		// Unhandled...
		break;
	}

	return EXIT_SUCCESS;
}